

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_range_count(nk_rune *range)

{
  nk_rune nVar1;
  undefined1 auVar2 [16];
  nk_rune *pnVar3;
  int local_24;
  nk_rune *local_20;
  nk_rune *iter;
  nk_rune *range_local;
  
  if (range == (nk_rune *)0x0) {
    __assert_fail("range",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x30f3,"int nk_range_count(const nk_rune *)");
  }
  local_20 = range;
  if (range == (nk_rune *)0x0) {
    range_local._4_4_ = 0;
  }
  else {
    do {
      pnVar3 = local_20 + 1;
      nVar1 = *local_20;
      local_20 = pnVar3;
    } while (nVar1 != 0);
    if (pnVar3 == range) {
      local_24 = 0;
    }
    else {
      auVar2._8_8_ = (long)pnVar3 - (long)range >> 0x3f;
      auVar2._0_8_ = (long)pnVar3 - (long)range >> 2;
      local_24 = SUB164(auVar2 / SEXT816(2),0);
    }
    range_local._4_4_ = local_24;
  }
  return range_local._4_4_;
}

Assistant:

NK_INTERN int
nk_range_count(const nk_rune *range)
{
    const nk_rune *iter = range;
    NK_ASSERT(range);
    if (!range) return 0;
    while (*(iter++) != 0);
    return (iter == range) ? 0 : (int)((iter - range)/2);
}